

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

xmlChar * xmlParseSGMLCatalogName(xmlChar *cur,xmlChar **name)

{
  byte bVar1;
  xmlChar *pxVar2;
  long lVar3;
  xmlChar buf [105];
  byte local_88 [112];
  
  *name = (xmlChar *)0x0;
  bVar1 = *cur;
  if ((((((byte)(bVar1 + 0x28) < 0x1f) || ((byte)(bVar1 + 0x40) < 0x17)) ||
       ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) || ((bVar1 - 0xf8 < 8 || (bVar1 == 0x5f)))) ||
     (bVar1 == 0x3a)) {
    lVar3 = 0;
    do {
      if ((((0x16 < (byte)(bVar1 + 0x40)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
          ((9 < (byte)(bVar1 - 0x30) && ((bVar1 < 0xf8 && (0x1e < (byte)(bVar1 + 0x28))))))) &&
         ((0x32 < bVar1 - 0x2d || ((0x4000000002003U >> ((ulong)(bVar1 - 0x2d) & 0x3f) & 1) == 0))))
      {
        pxVar2 = xmlStrndup(local_88,(int)lVar3);
        *name = pxVar2;
        return cur + lVar3;
      }
      local_88[lVar3] = bVar1;
      bVar1 = cur[lVar3 + 1];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 100);
  }
  return (xmlChar *)0x0;
}

Assistant:

static const xmlChar *
xmlParseSGMLCatalogName(const xmlChar *cur, xmlChar **name) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    int len = 0;
    int c;

    *name = NULL;

    /*
     * Handler for more complex cases
     */
    c = *cur;
    if ((!IS_LETTER(c) && (c != '_') && (c != ':'))) {
	return(NULL);
    }

    while (((IS_LETTER(c)) || (IS_DIGIT(c)) ||
            (c == '.') || (c == '-') ||
	    (c == '_') || (c == ':'))) {
	buf[len++] = c;
	cur++;
	c = *cur;
	if (len >= XML_MAX_NAMELEN)
	    return(NULL);
    }
    *name = xmlStrndup(buf, len);
    return(cur);
}